

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O3

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::create_initial_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  uintptr_t i_new_page;
  uintptr_t uVar1;
  bool bVar2;
  
  i_new_page = create_page(this,i_progress_guarantee);
  if (i_new_page == 0) {
    uVar1 = 0;
  }
  else {
    LOCK();
    uVar1 = (this->m_initial_page).super___atomic_base<unsigned_long>._M_i;
    bVar2 = uVar1 == 0;
    if (bVar2) {
      (this->m_initial_page).super___atomic_base<unsigned_long>._M_i = i_new_page;
      uVar1 = 0;
    }
    UNLOCK();
    if (!bVar2) {
      discard_created_page(this,i_new_page);
      i_new_page = uVar1;
    }
    LOCK();
    uVar1 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
    bVar2 = uVar1 == 0xffc0;
    if (bVar2) {
      (this->m_tail).super___atomic_base<unsigned_long>._M_i = i_new_page;
      uVar1 = 0xffc0;
    }
    UNLOCK();
    if (bVar2) {
      uVar1 = i_new_page;
    }
  }
  return uVar1;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              create_initial_page(LfQueue_ProgressGuarantee const i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                uintptr_t const first_page = create_page(i_progress_guarantee);
                if (first_page == 0)
                {
                    return 0;
                }

                /* note: in case of failure of the following CAS we do not give in even if we are wait-free,
                    because this is a one-shot operation, so we can't possibly stick in a loop. */
                uintptr_t initial_page = 0;
                if (m_initial_page.compare_exchange_strong(initial_page, first_page))
                {
                    initial_page = first_page;
                }
                else
                {
                    discard_created_page(first_page);
                }

                // m_tail = initial_page;
                auto tail = s_invalid_control_block;
                if (m_tail.compare_exchange_strong(tail, initial_page))
                {
                    return initial_page;
                }
                else
                {
                    return tail;
                }
            }